

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O0

bool __thiscall Potassco::AspifInput::doAttach(AspifInput *this,bool *inc)

{
  bool bVar1;
  BufferedStream *in_RSI;
  ProgramReader *in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  undefined1 cnd;
  bool local_1;
  
  bVar1 = ProgramReader::match
                    (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     false);
  if (bVar1) {
    ProgramReader::matchPos(in_RDI,in_stack_ffffffffffffffdc,(char *)0x10ae2d);
    ProgramReader::require(in_RDI,SUB41(in_stack_ffffffffffffffdc >> 0x18,0),(char *)0x10ae4a);
    ProgramReader::matchPos(in_RDI,in_stack_ffffffffffffffdc,(char *)0x10ae60);
    ProgramReader::require(in_RDI,SUB41(in_stack_ffffffffffffffdc >> 0x18,0),(char *)0x10ae7d);
    ProgramReader::matchPos
              (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    do {
      bVar1 = ProgramReader::match
                        (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
                                                ),false);
    } while (bVar1);
    bVar1 = ProgramReader::match
                      (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       false);
    cnd = (undefined1)(in_stack_ffffffffffffffdc >> 0x18);
    *(bool *)&in_RSI->str_ = bVar1;
    (**(code **)(*in_RDI[1]._vptr_ProgramReader + 0x10))
              (in_RDI[1]._vptr_ProgramReader,*(byte *)&in_RSI->str_ & 1,bVar1,
               CONCAT71((int7)((ulong)in_RSI >> 8),*(byte *)&in_RSI->str_) & 0xffffffffffffff01);
    ProgramReader::stream(in_RDI);
    BufferedStream::get(in_RSI);
    local_1 = ProgramReader::require(in_RDI,(bool)cnd,(char *)0x10af16);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool AspifInput::doAttach(bool& inc) {
	if (!match("asp ")) { return false; }
	require(matchPos() == 1, "unsupported major version");
	require(matchPos() == 0, "unsupported minor version");
	matchPos("revision number expected");
	while (match(" ", false)) { ; }
	inc  = match("incremental", false);
	out_.initProgram(inc);
	return require(stream()->get() == '\n', "invalid extra characters in problem line");
}